

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::WasmBytecodeGenerator
          (WasmBytecodeGenerator *this,ScriptContext *scriptContext,WasmReaderInfo *readerInfo,
          bool validateOnly)

{
  ArenaAllocator *this_00;
  WasmFunctionInfo *pWVar1;
  WebAssemblyModule *pWVar2;
  bool bVar3;
  uint uVar4;
  WasmByteCodeWriter *this_01;
  undefined **ppuVar5;
  WasmBinaryReader *pWVar6;
  
  this->opId = 0;
  this->lastOpId = 1;
  this_00 = &this->m_alloc;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            (&this_00->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             L"WasmBytecodeGen",&(scriptContext->threadContext->pageAllocator).super_PageAllocator,
             Js::Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  this->isUnreachable = false;
  this->m_scriptContext = scriptContext;
  bVar3 = Simd::IsEnabled();
  WAsmJs::TypedRegisterAllocator::TypedRegisterAllocator
            (&this->mTypedRegisterAllocator,this_00,AllocateRegisterSpace,(uint)!bVar3 << 4);
  this->currentProfileId = 0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_013e0aa0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_blockInfos).list.length = 0;
  (this->m_blockInfos).list.increment = 4;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc = this_00;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_013e0a48;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_evalStack).list.
  super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>.count = 0;
  (this->m_evalStack).list.length = 0;
  (this->m_evalStack).list.increment = 4;
  this_01 = (WasmByteCodeWriter *)new<Memory::ArenaAllocator>(8,this_00,0x35916e);
  ppuVar5 = &PTR_Create_013e0928;
  (this_01->super_IWasmByteCodeWriter)._vptr_IWasmByteCodeWriter =
       (_func_int **)&PTR_Create_013e0928;
  this->m_emptyWriter = (IWasmByteCodeWriter *)this_01;
  if (!validateOnly) {
    this_01 = (WasmByteCodeWriter *)new<Memory::ArenaAllocator>(0x138,this_00,0x35916e);
    memset(this_01,0,0x138);
    Js::WasmByteCodeWriter::WasmByteCodeWriter(this_01);
    ppuVar5 = (this_01->super_IWasmByteCodeWriter)._vptr_IWasmByteCodeWriter;
  }
  this->m_originalWriter = &this_01->super_IWasmByteCodeWriter;
  this->m_writer = &this_01->super_IWasmByteCodeWriter;
  (*(code *)*ppuVar5)(this_01);
  pWVar1 = (readerInfo->m_funcInfo).ptr;
  this->m_funcInfo = pWVar1;
  pWVar2 = (readerInfo->m_module).ptr;
  this->m_module = pWVar2;
  pWVar6 = (WasmBinaryReader *)(pWVar1->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (pWVar2->m_reader).ptr;
  }
  (**(pWVar6->super_WasmReaderBase)._vptr_WasmReaderBase)();
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  uVar4 = (*(pWVar6->super_WasmReaderBase)._vptr_WasmReaderBase[4])();
  (*this->m_writer->_vptr_IWasmByteCodeWriter[5])(this->m_writer,this_00,(ulong)uVar4);
  return;
}

Assistant:

WasmBytecodeGenerator::WasmBytecodeGenerator(Js::ScriptContext* scriptContext, WasmReaderInfo* readerInfo, bool validateOnly) :
    m_scriptContext(scriptContext),
    m_alloc(_u("WasmBytecodeGen"), scriptContext->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory),
    m_evalStack(&m_alloc),
    mTypedRegisterAllocator(&m_alloc, AllocateRegisterSpace, Simd::IsEnabled() ? 0 : 1 << WAsmJs::SIMD),
    m_blockInfos(&m_alloc),
    currentProfileId(0),
    isUnreachable(false)
{
    m_emptyWriter = Anew(&m_alloc, Js::EmptyWasmByteCodeWriter);
    m_writer = m_originalWriter = validateOnly ? m_emptyWriter : Anew(&m_alloc, Js::WasmByteCodeWriter);
    m_writer->Create();
    m_funcInfo = readerInfo->m_funcInfo;
    m_module = readerInfo->m_module;
    // Init reader to current func offset
    GetReader()->SeekToFunctionBody(m_funcInfo);

    const uint32 estimated = GetReader()->EstimateCurrentFunctionBytecodeSize();
    m_writer->InitData(&m_alloc, estimated);
}